

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix4d * math::view(Matrix4d *__return_storage_ptr__,Tuple4d *from,Tuple4d *to,Tuple4d *up)

{
  double dVar1;
  double *pdVar2;
  int i;
  size_t sVar3;
  int i_1;
  double local_238;
  Tuple4d true_up;
  Tuple4d forward;
  Matrix4d ret;
  Tuple4d left;
  Matrix4d local_130;
  Matrix4d local_b0;
  
  operator-((Tuple4d *)&ret,to,from);
  Tuple4d::normalize(&forward,(Tuple4d *)&ret);
  Tuple4d::normalize((Tuple4d *)&ret,up);
  cross(&left,&forward,(Tuple4d *)&ret);
  cross(&true_up,&left,&forward);
  identity();
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    pdVar2 = Tuple4d::operator()(&left,sVar3);
    dVar1 = *pdVar2;
    pdVar2 = Matrix4d::operator()(&ret,0,sVar3);
    *pdVar2 = dVar1;
  }
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    pdVar2 = Tuple4d::operator()(&true_up,sVar3);
    dVar1 = *pdVar2;
    pdVar2 = Matrix4d::operator()(&ret,1,sVar3);
    *pdVar2 = dVar1;
  }
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    pdVar2 = Tuple4d::operator()(&forward,sVar3);
    local_238 = -*pdVar2;
    pdVar2 = Matrix4d::operator()(&ret,2,sVar3);
    *pdVar2 = local_238;
  }
  identity();
  pdVar2 = Tuple4d::operator()(from,0);
  local_238 = -*pdVar2;
  pdVar2 = Tuple4d::operator()(from,1);
  dVar1 = *pdVar2;
  pdVar2 = Tuple4d::operator()(from,2);
  Matrix4d::translate(&local_b0,&local_130,local_238,-dVar1,-*pdVar2);
  operator*(__return_storage_ptr__,&ret,&local_b0);
  return __return_storage_ptr__;
}

Assistant:

math::Matrix4d math::view(const math::Tuple4d &from, const math::Tuple4d &to, const math::Tuple4d &up)
{
    math::Tuple4d forward = (to - from).normalize();
    math::Tuple4d left = cross(forward, up.normalize());
    math::Tuple4d true_up = cross(left, forward);

    math::Matrix4d ret{identity()};

    for (int i = 0; i < 3; i++)
    {
	ret(0, i) = left(i);
    }

    for (int i = 0; i < 3; i++)
    {
	ret(1, i) = true_up(i);
    }

    for (int i = 0; i < 3; i++)
    {
	ret(2, i) = -forward(i);
    }

    return (ret * identity().translate(-from(0), -from(1), -from(2)));
}